

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTEventLog.cpp
# Opt level: O0

void __thiscall TTD::EventLog::DoRtrSnapIfNeeded(EventLog *this)

{
  bool bVar1;
  EventLogEntry *pEVar2;
  JsRTCallFunctionAction *pJVar3;
  SnapShot *pSVar4;
  undefined1 local_58 [8];
  BaseHashSet<Js::FunctionBody_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::FunctionBody_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  liveTopLevelBodies;
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  JsRTCallFunctionAction *rootCall;
  EventLog *this_local;
  
  bVar1 = TTEventList::Iterator::IsValid(&this->m_currentReplayEventIterator);
  if (bVar1) {
    pEVar2 = TTEventList::Iterator::Current(&this->m_currentReplayEventIterator);
    bVar1 = NSLogEvents::IsJsRTActionRootCall(pEVar2);
    if (bVar1) {
      SetSnapshotOrInflateInProgress(this,true);
      PushMode(this,ExcludedExecutionTTAction);
      pEVar2 = TTEventList::Iterator::Current(&this->m_currentReplayEventIterator);
      pJVar3 = NSLogEvents::
               GetInlineEventDataAs<TTD::NSLogEvents::JsRTCallFunctionAction,(TTD::NSLogEvents::EventKind)68>
                         (pEVar2);
      if (pJVar3->AdditionalReplayInfo->RtRSnap == (SnapShot *)0x0) {
        AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
                  ((AutoNestedHandledExceptionType *)
                   ((long)&liveTopLevelBodies.
                           super_BaseDictionary<Js::FunctionBody_*,_Js::FunctionBody_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                           .stats + 4),ExceptionType_JavascriptException|ExceptionType_OutOfMemory);
        JsUtil::
        BaseHashSet<Js::FunctionBody_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::FunctionBody_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
        ::BaseHashSet((BaseHashSet<Js::FunctionBody_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::FunctionBody_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                       *)local_58,&Memory::HeapAllocator::Instance,0);
        pSVar4 = DoSnapshotExtract_Helper
                           (this,0.0,(BaseHashSet<Js::FunctionBody_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::FunctionBody_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                                      *)local_58);
        pJVar3->AdditionalReplayInfo->RtRSnap = pSVar4;
        JsUtil::
        BaseHashSet<Js::FunctionBody_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::FunctionBody_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
        ::~BaseHashSet((BaseHashSet<Js::FunctionBody_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::FunctionBody_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                        *)local_58);
        AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType
                  ((AutoNestedHandledExceptionType *)
                   ((long)&liveTopLevelBodies.
                           super_BaseDictionary<Js::FunctionBody_*,_Js::FunctionBody_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                           .stats + 4));
      }
      PopMode(this,ExcludedExecutionTTAction);
      SetSnapshotOrInflateInProgress(this,false);
      return;
    }
  }
  TTDAbort_unrecoverable_error("Something in wrong with the event position.");
}

Assistant:

void EventLog::DoRtrSnapIfNeeded()
    {
        TTDAssert(this->m_currentReplayEventIterator.IsValid() && NSLogEvents::IsJsRTActionRootCall(this->m_currentReplayEventIterator.Current()), "Something in wrong with the event position.");

        this->SetSnapshotOrInflateInProgress(true);
        this->PushMode(TTDMode::ExcludedExecutionTTAction);

        NSLogEvents::JsRTCallFunctionAction* rootCall = NSLogEvents::GetInlineEventDataAs<NSLogEvents::JsRTCallFunctionAction, NSLogEvents::EventKind::CallExistingFunctionActionTag>(this->m_currentReplayEventIterator.Current());
        if(rootCall->AdditionalReplayInfo->RtRSnap == nullptr)
        {
            //Be careful to ensure that caller is actually doing this
            AUTO_NESTED_HANDLED_EXCEPTION_TYPE((ExceptionType)(ExceptionType_OutOfMemory | ExceptionType_JavascriptException));

            JsUtil::BaseHashSet<Js::FunctionBody*, HeapAllocator> liveTopLevelBodies(&HeapAllocator::Instance); //don't actually care about the result here
            rootCall->AdditionalReplayInfo->RtRSnap = this->DoSnapshotExtract_Helper(0.0, liveTopLevelBodies);
        }

        this->PopMode(TTDMode::ExcludedExecutionTTAction);
        this->SetSnapshotOrInflateInProgress(false);
    }